

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall mp::SPAdapter::ProcessCons(SPAdapter *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer pRVar2;
  pointer piVar3;
  pointer pBVar4;
  int iVar5;
  ulong uVar6;
  pointer piVar7;
  int i;
  int stage;
  long lVar8;
  int i_1;
  pointer pRVar9;
  long lVar10;
  ulong uVar11;
  allocator_type local_61;
  ulong local_60;
  size_type local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> stage_offsets;
  
  uVar6 = ((long)(this->problem_->super_Problem).algebraic_cons_.
                 super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->problem_->super_Problem).algebraic_cons_.
                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x88;
  this_00 = &this->num_stage_cons_;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->num_stages_);
  iVar5 = (int)uVar6;
  if (iVar5 != 0) {
    local_50 = &this->con_orig2core_;
    local_58 = (size_type)iVar5;
    local_60 = uVar6;
    std::vector<int,_std::allocator<int>_>::resize(local_50,local_58);
    uVar6 = (ulong)(uint)*(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 1; lVar8 < this->num_stages_; lVar8 = lVar8 + 1) {
      uVar6 = (ulong)(int)uVar6;
      lVar10 = (long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8] + uVar6;
      for (; (long)uVar6 < lVar10; uVar6 = uVar6 + 1) {
        UpdateConStages(this,(this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar6],(int)lVar8);
      }
    }
    pRVar2 = (this->random_vars_).
             super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar9 = (this->random_vars_).
                  super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar9 != pRVar2; pRVar9 = pRVar9 + 1)
    {
      UpdateConStages(this,pRVar9->var_index,1);
    }
    uVar6 = 0;
    uVar11 = 0;
    if (0 < (int)local_60) {
      uVar11 = local_60 & 0xffffffff;
    }
    for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      piVar3 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar4 = (this->problem_->super_Problem).nonlinear_cons_.
               super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar6 < (ulong)((long)(this->problem_->super_Problem).nonlinear_cons_.
                                super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 3)) {
        iVar5 = piVar3[uVar6];
        if (pBVar4[uVar6].super_ExprBase.impl_ != (Impl *)0x0) {
          if (iVar5 < 2) {
            iVar5 = 1;
          }
          piVar3[uVar6] = iVar5;
        }
      }
      else {
        iVar5 = piVar3[uVar6];
      }
      piVar7 = (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar7) >> 2) <=
          iVar5) {
        std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(iVar5 + 1));
        iVar5 = piVar3[uVar6];
        piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      piVar7[iVar5] = piVar7[iVar5] + 1;
    }
    uVar6 = (long)(this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) < uVar6) {
      iVar5 = (int)(uVar6 >> 2);
      this->num_stages_ = iVar5;
      std::vector<int,_std::allocator<int>_>::resize(&this->num_stage_vars_,(long)iVar5);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->con_core2orig_,local_58);
    std::vector<int,_std::allocator<int>_>::vector(&stage_offsets,(long)this->num_stages_,&local_61)
    ;
    piVar3 = (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = 1; lVar8 < this->num_stages_; lVar8 = lVar8 + 1) {
      stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] =
           piVar3[lVar8 + -1] +
           stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar8 + -1];
    }
    piVar3 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      iVar5 = piVar3[uVar6];
      iVar1 = stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar5];
      stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar5] = iVar1 + 1;
      piVar7[iVar1] = (int)uVar6;
      piVar3[uVar6] = iVar1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&stage_offsets.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void SPAdapter::ProcessCons() {
  int num_cons = problem_.num_algebraic_cons();
  num_stage_cons_.resize(num_stages_);
  if (num_cons == 0)
    return;
  // Compute stage of each constraint as a maximum of stages of variables
  // in it and temporarily store stages in con_orig2core_.
  con_orig2core_.resize(num_cons);
  int core_var_index = num_stage_vars_[0];
  for (int stage = 1; stage < num_stages_; ++stage) {
    for (int n = core_var_index + num_stage_vars_[stage];
         core_var_index < n; ++core_var_index) {
      UpdateConStages(var_core2orig_[core_var_index], stage);
    }
  }
  // Constraints containing random variables should be at least in the
  // second stage.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i)
    UpdateConStages(i->var_index, 1);
  for (int i = 0; i < num_cons; ++i) {
    int &stage = con_orig2core_[i];
    if (problem_.algebraic_con(i).nonlinear_expr())
      stage = std::max(con_orig2core_[i], 1);
    if (stage >= static_cast<int>(num_stage_cons_.size()))
      num_stage_cons_.resize(stage + 1);
    ++num_stage_cons_[stage];
  }
  if (num_stage_cons_.size() > num_stage_vars_.size()) {
    num_stages_ = (int)num_stage_cons_.size();
    num_stage_vars_.resize(num_stages_);
  }
  // Reorder constraints by stages.
  con_core2orig_.resize(num_cons);
  std::vector<int> stage_offsets(num_stages_);
  for (int i = 1; i < num_stages_; ++i)
    stage_offsets[i] = stage_offsets[i - 1] + num_stage_cons_[i - 1];
  for (int i = 0; i < num_cons; ++i) {
    int stage = con_orig2core_[i];
    int core_con_index = stage_offsets[stage]++;
    con_core2orig_[core_con_index] = i;
    con_orig2core_[i] = core_con_index++;
  }
}